

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool cmTargetLinkLibrariesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  pointer puVar2;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  int iVar7;
  cmake *pcVar8;
  cmTarget *this;
  string *psVar9;
  ostream *poVar10;
  size_t sVar11;
  cmMakefile *pcVar12;
  const_iterator cVar13;
  cmValue cVar14;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  pointer puVar15;
  long *plVar16;
  undefined7 uVar18;
  ulong uVar17;
  pointer pbVar19;
  ProcessingState currentProcessingState;
  ProcessingState PVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  char *__s;
  long lVar24;
  ulong uVar25;
  cmMakefile *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  currentEntry;
  TLL tll;
  ostringstream e;
  cmDirectoryId dirId;
  long local_2d8;
  cmTargetLinkLibraryType local_2cc;
  undefined1 local_2b9;
  string local_2b8;
  char local_298;
  undefined1 local_290 [24];
  string local_278 [8];
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  __node_base_ptr *local_258;
  size_type local_250;
  __node_base local_248;
  size_type sStack_240;
  float local_238;
  size_t local_230;
  __node_base_ptr p_Stack_228;
  ProcessingState local_220;
  uint local_21c;
  cmTarget *local_218;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  undefined8 local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  ios_base *local_1b0 [2];
  ios_base local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  long *local_110 [2];
  long local_100 [2];
  undefined1 local_f0 [88];
  undefined1 local_98 [56];
  cmMakefile *local_60;
  ulong local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  
  psVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (psVar9 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_210._0_8_ = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_004b3193:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
    }
    return false;
  }
  this_00 = status->Makefile;
  bVar4 = cmMakefile::IsAlias(this_00,psVar9);
  if (bVar4) {
    local_210._0_8_ = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"can not be used on an ALIAS target.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_004b3193;
  }
  pcVar8 = cmMakefile::GetCMakeInstance(this_00);
  this = cmGlobalGenerator::FindTarget
                   ((pcVar8->GlobalGenerator)._M_t.
                    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                    .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,false);
  if (this == (cmTarget *)0x0) {
    puVar2 = (this_00->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (this_00->ImportedTargetsOwned).
                   super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
        puVar15 = puVar15 + 1) {
      psVar9 = cmTarget::GetName_abi_cxx11_
                         ((puVar15->_M_t).
                          super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
                          super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                          super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar11 = psVar9->_M_string_length;
      if ((sVar11 == pbVar19->_M_string_length) &&
         ((sVar11 == 0 ||
          (iVar7 = bcmp((psVar9->_M_dataplus)._M_p,(pbVar19->_M_dataplus)._M_p,sVar11), iVar7 == 0))
         )) {
        this = (puVar15->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
               super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
               super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
        if (this != (cmTarget *)0x0) goto LAB_004b31ec;
        break;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_210,"Cannot specify link libraries for target \"",0x2a);
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_210,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"which is not built by this project.",0x23);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar6 = cmMakefile::GetPolicyStatus(this_00,CMP0016,false);
      if (PVar6 - REQUIRED_IF_USED < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"\n",1);
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_290,(cmPolicies *)0x10,id_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_210,(char *)local_290._0_8_,local_290._8_8_);
        if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
          operator_delete((void *)local_290._0_8_,
                          CONCAT53(local_290._19_5_,
                                   CONCAT12(local_290[0x12],
                                            CONCAT11(local_290[0x11],local_290[0x10]))) + 1);
        }
      }
      else {
        if (PVar6 == OLD) goto LAB_004b3ed8;
        if (PVar6 == WARN) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_210,
                     "CMake does not support this but it used to work accidentally ",0x3d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_210,"and is being allowed for compatibility.",0x27);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"\n",1);
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_290,(cmPolicies *)0x10,id_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_210,(char *)local_290._0_8_,local_290._8_8_);
          if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
            operator_delete((void *)local_290._0_8_,
                            CONCAT53(local_290._19_5_,
                                     CONCAT12(local_290[0x12],
                                              CONCAT11(local_290[0x11],local_290[0x10]))) + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_290);
          if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
            operator_delete((void *)local_290._0_8_,
                            CONCAT53(local_290._19_5_,
                                     CONCAT12(local_290[0x12],
                                              CONCAT11(local_290[0x11],local_290[0x10]))) + 1);
          }
          goto LAB_004b3ed8;
        }
      }
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_290);
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,
                      CONCAT53(local_290._19_5_,
                               CONCAT12(local_290[0x12],CONCAT11(local_290[0x11],local_290[0x10])))
                      + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
LAB_004b3ed8:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    return true;
  }
LAB_004b31ec:
  TVar5 = cmTarget::GetType(this);
  if (TVar5 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    PVar6 = cmMakefile::GetPolicyStatus(this_00,CMP0039,false);
    if (PVar6 - NEW < 3) {
      __s = "must";
      t = FATAL_ERROR;
      bVar4 = true;
LAB_004b3300:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_210,"Utility target \"",0x10);
      psVar9 = cmTarget::GetName_abi_cxx11_(this);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
      sVar11 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," not be used as the target of a target_link_libraries call.",0x3b);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,t,(string *)local_290);
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,
                        CONCAT53(local_290._19_5_,
                                 CONCAT12(local_290[0x12],CONCAT11(local_290[0x11],local_290[0x10]))
                                ) + 1);
      }
      if (bVar4) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
        std::ios_base::~ios_base(local_1a0);
        return false;
      }
    }
    else if (PVar6 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_290,(cmPolicies *)0x27,id);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_210,(char *)local_290._0_8_,local_290._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,
                        CONCAT53(local_290._19_5_,
                                 CONCAT12(local_290[0x12],CONCAT11(local_290[0x11],local_290[0x10]))
                                ) + 1);
      }
      __s = "should";
      bVar4 = false;
      t = AUTHOR_WARNING;
      goto LAB_004b3300;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
  }
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    return true;
  }
  local_278 = (string  [8])&local_268;
  local_290[0x10] = '\0';
  local_290[0x11] = '\0';
  local_290[0x12] = '\0';
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_258 = &p_Stack_228;
  local_250 = 1;
  local_248._M_nxt = (_Hash_node_base *)0x0;
  sStack_240 = 0;
  local_238 = 1.0;
  local_230 = 0;
  p_Stack_228 = (__node_base_ptr)0x0;
  local_290._0_8_ = this_00;
  local_290._8_8_ = this;
  pcVar12 = cmTarget::GetMakefile(this);
  if (pcVar12 != this_00) {
    PVar6 = cmMakefile::GetPolicyStatus((cmMakefile *)local_290._0_8_,CMP0079,false);
    if (PVar6 - NEW < 3) {
      local_290[0x12] = '\x01';
    }
    else {
      if (PVar6 != OLD) {
        if (PVar6 != WARN) goto LAB_004b365a;
        local_290[0x10] = '\x01';
      }
      local_290[0x11] = '\x01';
    }
  }
LAB_004b365a:
  if (local_290[0x12] == '\x01') {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_98,(cmMakefile *)local_290._0_8_);
    local_210._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3;
    local_210._8_8_ = "::@";
    local_200._M_allocated_capacity = 0;
    local_200._8_8_ = local_98._8_8_;
    local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._0_8_;
    local_1e8 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_210;
    cmCatViews(&local_2b8,views);
    std::__cxx11::string::operator=(local_278,(string *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
  }
  local_298 = '\0';
  if ((cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keywords_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::keywords_abi_cxx11_), iVar7 != 0)) {
    local_210._0_8_ = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"LINK_INTERFACE_LIBRARIES","");
    local_1f0 = &local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"INTERFACE","");
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"LINK_PUBLIC","");
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"PUBLIC","");
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"LINK_PRIVATE","");
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"PRIVATE","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"debug","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"optimized","");
    plVar16 = local_100;
    local_110[0] = plVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"general","");
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,local_210,local_f0,0,local_98,&local_50,&local_2b9);
    lVar24 = -0x120;
    do {
      if (plVar16 != (long *)plVar16[-2]) {
        operator_delete((long *)plVar16[-2],*plVar16 + 1);
      }
      plVar16 = plVar16 + -4;
      lVar24 = lVar24 + 0x20;
    } while (lVar24 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keywords_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keywords_abi_cxx11_);
  }
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19)) {
    uVar22 = 1;
    local_2cc = GENERAL_LibraryType;
    currentProcessingState = ProcessingLinkLibraries;
    uVar17 = 0;
    local_2d8 = 0;
    local_218 = this;
    local_60 = this_00;
LAB_004b376c:
    cVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                     ::keywords_abi_cxx11_._M_h,pbVar19 + uVar22);
    uVar23 = uVar22;
    if (cVar13.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      if ((uVar17 & 1) != 0) {
        if (local_298 == '\x01') {
          __assert_fail("!currentEntry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                        ,0x143,
                        "bool cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                       );
        }
        bVar4 = anon_unknown.dwarf_1c6c983::TLL::HandleLibrary
                          ((TLL *)local_290,currentProcessingState,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar22,local_2cc);
        uVar17 = 0;
        local_2cc = GENERAL_LibraryType;
        if (!bVar4) goto LAB_004b4237;
        goto LAB_004b3d7b;
      }
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar23 = pbVar19[uVar22]._M_string_length;
      local_58 = uVar22;
      if (uVar23 != 0) {
        pcVar3 = pbVar19[uVar22]._M_dataplus._M_p;
        uVar25 = 0;
        local_220 = currentProcessingState;
        local_21c = (uint)uVar17;
        do {
          pcVar1 = pcVar3 + uVar25;
          __str._M_str = "$<";
          __str._M_len = 2;
          local_210._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(uVar23 - uVar25);
          local_210._8_8_ = pcVar1;
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_210,0,2,__str
                            );
          if (iVar7 == 0) {
            local_2d8 = local_2d8 + 1;
            uVar25 = uVar25 + 1;
          }
          else if (local_2d8 == 0) {
            local_2d8 = 0;
          }
          else {
            __str_00._M_str = ">";
            __str_00._M_len = 1;
            local_210._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(uVar23 - uVar25);
            local_210._8_8_ = pcVar1;
            iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_210,0,1,
                               __str_00);
            local_2d8 = local_2d8 - (ulong)(iVar7 == 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < uVar23);
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (ulong)local_21c;
        this_00 = local_60;
        currentProcessingState = local_220;
      }
      uVar23 = local_58;
      __u = pbVar19 + uVar22;
      if (local_298 == '\x01') {
        local_210._0_8_ = local_2b8._M_string_length;
        local_210._8_8_ = local_2b8._M_dataplus._M_p;
        local_200._M_allocated_capacity = 0;
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_98._8_8_ = 1;
        local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_98 + 0x18);
        local_98[0x18] = ';';
        local_200._8_8_ = 1;
        local_1e8 = 0;
        local_1e0._8_8_ = (__u->_M_dataplus)._M_p;
        local_1e0._M_allocated_capacity = __u->_M_string_length;
        local_1d0[0] = (undefined1 *)0x0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_210;
        local_98._16_8_ = local_1f0;
        cmCatViews(&local_50,views_00);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_2b8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_2b8,__u);
      }
      if (local_2d8 != 0) goto LAB_004b3d7b;
      if (local_298 != '\x01') goto LAB_004b3942;
      bVar4 = anon_unknown.dwarf_1c6c983::TLL::HandleLibrary
                        ((TLL *)local_290,currentProcessingState,&local_2b8,GENERAL_LibraryType);
      if (!bVar4) goto LAB_004b3e2e;
      if ((local_298 == '\x01') &&
         (local_298 = '\0',
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_2b8._M_dataplus._M_p != &local_2b8.field_2)) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (local_298 == '\x01') {
        if ((uVar17 & 1) != 0) goto LAB_004b3db6;
        bVar4 = anon_unknown.dwarf_1c6c983::TLL::HandleLibrary
                          ((TLL *)local_290,currentProcessingState,&local_2b8,GENERAL_LibraryType);
        if (!bVar4) goto LAB_004b3e2e;
        if ((local_298 == '\x01') &&
           (local_298 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2b8._M_dataplus._M_p != &local_2b8.field_2)) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar22));
      iVar21 = (int)uVar22;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar22));
        if (iVar7 == 0) {
          if ((iVar21 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
            local_2d8 = 0;
            currentProcessingState = ProcessingKeywordLinkInterface;
          }
          else {
            PVar20 = currentProcessingState & ~ProcessingKeywordLinkInterface;
            local_2d8 = 0;
            currentProcessingState = ProcessingKeywordLinkInterface;
            if (PVar20 != ProcessingKeywordPublicInterface) {
              local_210._0_8_ = &local_200;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_210,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,"");
              cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
              goto LAB_004b4217;
            }
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar22));
          if (iVar7 == 0) {
            if ((iVar21 == 1) || (currentProcessingState == ProcessingPlainPrivateInterface)) {
              local_2d8 = 0;
              currentProcessingState = ProcessingPlainPublicInterface;
            }
            else {
              local_2d8 = 0;
              bVar4 = currentProcessingState != ProcessingPlainPublicInterface;
              currentProcessingState = ProcessingPlainPublicInterface;
              if (bVar4) {
                local_210._0_8_ = &local_200;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_210,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,"");
                cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
                goto LAB_004b4217;
              }
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar22));
            if (iVar7 == 0) {
              if ((iVar21 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
                local_2d8 = 0;
                currentProcessingState = ProcessingKeywordPublicInterface;
              }
              else {
                PVar20 = currentProcessingState & ~ProcessingKeywordLinkInterface;
                local_2d8 = 0;
                currentProcessingState = ProcessingKeywordPublicInterface;
                if (PVar20 != ProcessingKeywordPublicInterface) {
                  local_210._0_8_ = &local_200;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_210,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,"");
                  cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
                  goto LAB_004b4217;
                }
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar22));
              if (iVar7 == 0) {
                if ((iVar21 == 1) || (currentProcessingState == ProcessingPlainPublicInterface)) {
                  local_2d8 = 0;
                  currentProcessingState = ProcessingPlainPrivateInterface;
                }
                else {
                  local_2d8 = 0;
                  bVar4 = currentProcessingState != ProcessingPlainPrivateInterface;
                  currentProcessingState = ProcessingPlainPrivateInterface;
                  if (bVar4) {
                    local_210._0_8_ = &local_200;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_210,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,"");
                    cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
                    goto LAB_004b4217;
                  }
                }
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar22));
                if (iVar7 == 0) {
                  if ((iVar21 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
                    local_2d8 = 0;
                    currentProcessingState = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    PVar20 = currentProcessingState & ~ProcessingKeywordLinkInterface;
                    local_2d8 = 0;
                    currentProcessingState = ProcessingKeywordPrivateInterface;
                    if (PVar20 != ProcessingKeywordPublicInterface) {
                      local_210._0_8_ = &local_200;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_210,
                                 "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,"");
                      cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
                      goto LAB_004b4217;
                    }
                  }
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar22));
                  uVar18 = (undefined7)(uVar17 >> 8);
                  if (iVar7 == 0) {
                    if ((uVar17 & 1) == 0) {
                      local_2cc = DEBUG_LibraryType;
LAB_004b3d59:
                      local_2d8 = 0;
                      uVar17 = CONCAT71(uVar18,1);
                    }
                    else {
                      LinkLibraryTypeSpecifierWarning(this_00,local_2cc,1);
                      local_2d8 = 0;
                      uVar17 = CONCAT71(uVar18,1);
                      local_2cc = DEBUG_LibraryType;
                    }
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar22)
                                      );
                    if (iVar7 == 0) {
                      if ((uVar17 & 1) == 0) {
                        local_2cc = OPTIMIZED_LibraryType;
                        goto LAB_004b3d59;
                      }
                      LinkLibraryTypeSpecifierWarning(this_00,local_2cc,2);
                      local_2d8 = 0;
                      uVar17 = CONCAT71(uVar18,1);
                      local_2cc = OPTIMIZED_LibraryType;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar22));
                      if (iVar7 != 0) goto LAB_004b3942;
                      if ((uVar17 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(this_00,local_2cc,0);
                      }
                      local_2d8 = 0;
                      uVar17 = CONCAT71(uVar18,1);
                      local_2cc = GENERAL_LibraryType;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_004b3d7b;
      }
      if (iVar21 != 1) {
        local_210._0_8_ = &local_200;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,
                   "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                   ,"");
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
LAB_004b4217:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ != &local_200) {
          operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
        }
        uVar17 = 1;
        goto LAB_004b4237;
      }
      currentProcessingState = ProcessingPlainLinkInterface;
    }
LAB_004b3942:
    local_2d8 = 0;
LAB_004b3d7b:
    this = local_218;
    uVar22 = (ulong)((int)uVar23 + 1);
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >> 5) <= uVar22)
    goto code_r0x004b3d9d;
    goto LAB_004b376c;
  }
  currentProcessingState = ProcessingLinkLibraries;
  if (local_298 != '\0') goto LAB_004b3de3;
  goto LAB_004b3f79;
code_r0x004b3d9d:
  if (local_298 == '\0') {
    if ((uVar17 & 1) != 0) {
      cmStrCat<char_const(&)[6],char_const*&,char_const(&)[42]>
                ((string *)local_210,(char (*) [6])"The \"",
                 (char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)local_2cc * 8),
                 (char (*) [42])"\" argument must be followed by a library.");
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != &local_200) {
        operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
  }
  else {
    if ((uVar17 & 1) != 0) {
LAB_004b3db6:
      __assert_fail("!haveLLT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                    ,0xc2,
                    "auto cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)::(anonymous class)::operator()() const"
                   );
    }
LAB_004b3de3:
    bVar4 = anon_unknown.dwarf_1c6c983::TLL::HandleLibrary
                      ((TLL *)local_290,currentProcessingState,&local_2b8,GENERAL_LibraryType);
    if (!bVar4) {
LAB_004b3e2e:
      uVar17 = 0;
      goto LAB_004b4237;
    }
    if ((local_298 == '\x01') &&
       (local_298 = '\0',
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2b8._M_dataplus._M_p != &local_2b8.field_2)) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
LAB_004b3f79:
  PVar6 = cmTarget::GetPolicyStatus(this,CMP0022);
  uVar17 = 1;
  if (currentProcessingState != ProcessingLinkLibraries && PVar6 < NEW) {
    local_210._0_8_ = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"LINK_INTERFACE_LIBRARIES","");
    cVar14 = cmTarget::GetProperty(this,(string *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
    }
    if (cVar14.Value == (string *)0x0) {
      local_210._0_8_ = &local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"LINK_INTERFACE_LIBRARIES","");
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      cmTarget::SetProperty(this,(string *)local_210,(string *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != &local_200) {
        operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
      }
    }
  }
LAB_004b4237:
  if ((local_298 == '\x01') &&
     (local_298 = '\0',
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_2b8._M_dataplus._M_p != &local_2b8.field_2)) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown.dwarf_1c6c983::TLL::~TLL((TLL *)local_290);
  return SUB81(uVar17,0);
}

Assistant:

bool cmTargetLinkLibrariesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  // Must have at least one argument.
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Alias targets cannot be on the LHS of this command.
  if (mf.IsAlias(args[0])) {
    status.SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  cmTarget* target =
    mf.GetCMakeInstance()->GetGlobalGenerator()->FindTarget(args[0]);
  if (!target) {
    for (const auto& importedTarget : mf.GetOwnedImportedTargets()) {
      if (importedTarget->GetName() == args[0]) {
        target = importedTarget.get();
        break;
      }
    }
  }
  if (!target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (mf.GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccurred();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (modal) {
      e << "Utility target \"" << target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  TLL tll(mf, target);

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  ProcessingState currentProcessingState = ProcessingLinkLibraries;

  // Accumulate consectuive non-keyword arguments into one entry in
  // order to handle unquoted generator expressions containing ';'.
  std::size_t genexNesting = 0;
  cm::optional<std::string> currentEntry;
  auto processCurrentEntry = [&]() -> bool {
    // FIXME: Warn about partial genex if genexNesting > 0?
    genexNesting = 0;
    if (currentEntry) {
      assert(!haveLLT);
      if (!tll.HandleLibrary(currentProcessingState, *currentEntry,
                             GENERAL_LibraryType)) {
        return false;
      }
      currentEntry = cm::nullopt;
    }
    return true;
  };
  auto extendCurrentEntry = [&currentEntry](std::string const& arg) {
    if (currentEntry) {
      currentEntry = cmStrCat(*currentEntry, ';', arg);
    } else {
      currentEntry = arg;
    }
  };

  // Keep this list in sync with the keyword dispatch below.
  static std::unordered_set<std::string> const keywords{
    "LINK_INTERFACE_LIBRARIES",
    "INTERFACE",
    "LINK_PUBLIC",
    "PUBLIC",
    "LINK_PRIVATE",
    "PRIVATE",
    "debug",
    "optimized",
    "general",
  };

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (keywords.count(args[i])) {
      // A keyword argument terminates any accumulated partial genex.
      if (!processCurrentEntry()) {
        return false;
      }

      // Process this keyword argument.
      if (args[i] == "LINK_INTERFACE_LIBRARIES") {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (i != 1) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_INTERFACE_LIBRARIES option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
      } else if (args[i] == "INTERFACE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordLinkInterface;
      } else if (args[i] == "LINK_PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPrivateInterface &&
            currentProcessingState != ProcessingPlainPublicInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPublicInterface;
      } else if (args[i] == "PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPublicInterface;
      } else if (args[i] == "LINK_PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPublicInterface &&
            currentProcessingState != ProcessingPlainPrivateInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPrivateInterface;
      } else if (args[i] == "PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPrivateInterface;
      } else if (args[i] == "debug") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, DEBUG_LibraryType);
        }
        llt = DEBUG_LibraryType;
        haveLLT = true;
      } else if (args[i] == "optimized") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, OPTIMIZED_LibraryType);
        }
        llt = OPTIMIZED_LibraryType;
        haveLLT = true;
      } else if (args[i] == "general") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, GENERAL_LibraryType);
        }
        llt = GENERAL_LibraryType;
        haveLLT = true;
      }
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      assert(!currentEntry);
      if (!tll.HandleLibrary(currentProcessingState, args[i], llt)) {
        return false;
      }
      llt = GENERAL_LibraryType;
    } else {
      // Track the genex nesting level.
      {
        cm::string_view arg = args[i];
        for (std::string::size_type pos = 0; pos < arg.size(); ++pos) {
          cm::string_view cur = arg.substr(pos);
          if (cmHasLiteralPrefix(cur, "$<")) {
            ++genexNesting;
            ++pos;
          } else if (genexNesting > 0 && cmHasLiteralPrefix(cur, ">")) {
            --genexNesting;
          }
        }
      }

      // Accumulate this argument in the current entry.
      extendCurrentEntry(args[i]);

      // Process this entry if it does not end inside a genex.
      if (genexNesting == 0) {
        if (!processCurrentEntry()) {
          return false;
        }
      }
    }
  }

  // Process the last accumulated partial genex, if any.
  if (!processCurrentEntry()) {
    return false;
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    cmStrCat("The \"", LinkLibraryTypeNames[llt],
                             "\" argument must be followed by a library."));
    cmSystemTools::SetFatalErrorOccurred();
  }

  const cmPolicies::PolicyStatus policy22Status =
    target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      currentProcessingState != ProcessingLinkLibraries &&
      !target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}